

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint64_t *encbytes;
  Classifier *pCVar1;
  ChannelData *pCVar2;
  undefined1 auVar3 [16];
  uint8_t uVar4;
  exr_pixel_type_t eVar5;
  CompressorScheme CVar6;
  undefined8 *__s;
  undefined8 *puVar7;
  char *pcVar8;
  CscChannelSet *pCVar9;
  exr_coding_channel_info_t *peVar10;
  uint8_t *puVar11;
  exr_const_context_t_conflict p_Var12;
  void *in;
  bool bVar13;
  exr_result_t eVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  size_t sVar18;
  uint16_t *puVar19;
  uint64_t uVar20;
  size_t sVar21;
  exr_encode_pipeline_t *peVar22;
  unsigned_short *toNonlinear;
  ulong uVar23;
  ChannelData *pCVar24;
  uint8_t *puVar25;
  ulong uVar26;
  char *__s1;
  uint8_t *puVar27;
  long lVar28;
  DctCoderChannelData *dcd;
  long lVar29;
  long lVar30;
  size_t sVar31;
  uint8_t *packedDc;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  size_t outBufferSize;
  LossyDctEncoder enc;
  void *local_3c8;
  ulong local_3b8;
  size_t local_398;
  size_t local_390;
  ulong local_388;
  LossyDctEncoder local_380;
  
  local_398 = 0;
  me->_channelRules = sDefaultChannelRules;
  me->_channelRuleCount = 0xf;
  DwaCompressor_initializeBuffers(me,&local_398);
  sVar21 = local_398;
  peVar22 = me->_encode;
  if (peVar22->compressed_alloc_size < 0x58) {
    return 1;
  }
  eVar14 = internal_encode_alloc_buffer
                     (peVar22,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar22->compressed_buffer,
                      &peVar22->compressed_alloc_size,local_398);
  if (eVar14 != 0) {
    return eVar14;
  }
  __s = (undefined8 *)me->_encode->compressed_buffer;
  memset(__s,0,me->_encode->compressed_alloc_size);
  local_390 = sVar21;
  if (sVar21 < 2) {
    return 1;
  }
  local_3c8 = (void *)((long)__s + 0x5a);
  uVar26 = me->_channelRuleCount;
  if (uVar26 == 0) {
    local_3b8 = 2;
  }
  else {
    local_3b8 = 2;
    uVar23 = 0;
    do {
      iVar16 = me->_numChannels;
      if (0 < (long)iVar16) {
        pCVar24 = me->_channelData;
        pCVar1 = me->_channelRules + uVar23;
        eVar5 = pCVar1->_type;
        lVar29 = 0;
        local_388 = uVar26;
        do {
          puVar7 = *(undefined8 **)((long)pCVar24->planarUncRle + lVar29 + -0x18);
          pcVar8 = (char *)*puVar7;
          pcVar17 = strrchr(pcVar8,0x2e);
          __s1 = pcVar17 + 1;
          if (pcVar17 == (char *)0x0) {
            __s1 = pcVar8;
          }
          if (eVar5 == *(ushort *)((long)puVar7 + 0x1a)) {
            pcVar8 = pCVar1->_suffix;
            if (pCVar1->_caseInsensitive == 0) {
              iVar15 = strcmp(__s1,pcVar8);
            }
            else {
              iVar15 = strcasecmp(__s1,pcVar8);
            }
            if (iVar15 == 0) {
              sVar31 = strlen(pcVar8);
              if (local_390 < sVar31 + local_3b8 + 3) {
                return 1;
              }
              sVar31 = strlen(pcVar8);
              memcpy(local_3c8,pcVar8,sVar31 + 1);
              *(byte *)((long)local_3c8 + sVar31 + 1) =
                   ((byte)pCVar1->_caseInsensitive & 1 |
                   (char)(pCVar1->_cscIdx << 4) + ((byte)pCVar1->_scheme & 3) * '\x04') + 0x10;
              *(char *)((long)local_3c8 + sVar31 + 2) = (char)pCVar1->_type;
              local_3b8 = local_3b8 + 3 + sVar31;
              uVar26 = me->_channelRuleCount;
              local_3c8 = (void *)((long)local_3c8 + sVar31 + 3);
              break;
            }
          }
          lVar29 = lVar29 + 0x240;
          uVar26 = local_388;
        } while ((long)iVar16 * 0x240 != lVar29);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar26);
    if (0xffff < local_3b8) {
      return 1;
    }
  }
  *(short *)(__s + 0xb) = (short)local_3b8;
  local_3b8 = local_3b8 + 0x58;
  if (me->_encode->compressed_alloc_size <= local_3b8) {
    return 1;
  }
  puVar25 = me->_packedAcBuffer;
  packedDc = me->_packedDcBuffer;
  *__s = 2;
  __s[10] = (ulong)me->_acCompression;
  DwaCompressor_setupChannelData(me);
  auVar3 = _DAT_001350e0;
  iVar16 = me->_numChannels;
  uVar26 = (ulong)iVar16;
  if (0 < (long)uVar26) {
    pCVar24 = me->_channelData;
    lVar29 = uVar26 - 1;
    auVar32._8_4_ = (int)lVar29;
    auVar32._0_8_ = lVar29;
    auVar32._12_4_ = (int)((ulong)lVar29 >> 0x20);
    lVar29 = 0;
    auVar32 = auVar32 ^ _DAT_001350e0;
    auVar33 = _DAT_001350b0;
    auVar34 = _DAT_001350c0;
    do {
      auVar35 = auVar34 ^ auVar3;
      iVar15 = auVar32._4_4_;
      if ((bool)(~(auVar35._4_4_ == iVar15 && auVar32._0_4_ < auVar35._0_4_ ||
                  iVar15 < auVar35._4_4_) & 1)) {
        puVar27 = pCVar24->_pad + lVar29 + -0xc;
        puVar27[0] = '\0';
        puVar27[1] = '\0';
        puVar27[2] = '\0';
        puVar27[3] = '\0';
      }
      if ((auVar35._12_4_ != auVar32._12_4_ || auVar35._8_4_ <= auVar32._8_4_) &&
          auVar35._12_4_ <= auVar32._12_4_) {
        puVar27 = pCVar24[1]._pad + lVar29 + -0xc;
        puVar27[0] = '\0';
        puVar27[1] = '\0';
        puVar27[2] = '\0';
        puVar27[3] = '\0';
      }
      auVar35 = auVar33 ^ auVar3;
      iVar36 = auVar35._4_4_;
      if (iVar36 <= iVar15 && (iVar36 != iVar15 || auVar35._0_4_ <= auVar32._0_4_)) {
        puVar27 = pCVar24[2]._pad + lVar29 + -0xc;
        puVar27[0] = '\0';
        puVar27[1] = '\0';
        puVar27[2] = '\0';
        puVar27[3] = '\0';
        puVar27 = pCVar24[3]._pad + lVar29 + -0xc;
        puVar27[0] = '\0';
        puVar27[1] = '\0';
        puVar27[2] = '\0';
        puVar27[3] = '\0';
      }
      lVar30 = auVar34._8_8_;
      auVar34._0_8_ = auVar34._0_8_ + 4;
      auVar34._8_8_ = lVar30 + 4;
      lVar30 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 4;
      auVar33._8_8_ = lVar30 + 4;
      lVar29 = lVar29 + 0x900;
    } while ((ulong)(iVar16 + 3U >> 2) * 0x900 != lVar29);
  }
  iVar16 = me->_max[1];
  if (me->_min[1] <= iVar16) {
    puVar27 = (uint8_t *)me->_encode->packed_buffer;
    iVar15 = me->_min[1];
    do {
      if (0 < (int)uVar26) {
        lVar30 = 0;
        lVar29 = 0;
        do {
          lVar28 = *(long *)((long)me->_channelData->planarUncRle + lVar30 + -0x18);
          if (iVar15 % *(int *)(lVar28 + 0x14) == 0) {
            eVar14 = DctCoderChannelData_push_row
                               (me->alloc_fn,me->free_fn,
                                (DctCoderChannelData *)
                                ((long)(me->_channelData->_dctData)._dctData + lVar30),puVar27);
            if (eVar14 != 0) {
              return 1;
            }
            puVar27 = puVar27 + (long)*(char *)(lVar28 + 0x19) * (long)*(int *)(lVar28 + 0xc);
            uVar26 = (ulong)(uint)me->_numChannels;
          }
          lVar29 = lVar29 + 1;
          lVar30 = lVar30 + 0x240;
        } while (lVar29 < (int)uVar26);
        iVar16 = me->_max[1];
      }
      bVar13 = iVar15 < iVar16;
      iVar15 = iVar15 + 1;
    } while (bVar13);
  }
  if (0 < me->_numCscChannelSets) {
    pCVar24 = me->_channelData;
    lVar30 = 8;
    lVar29 = 0;
    do {
      pCVar9 = me->_cscChannelSets;
      iVar16 = *(int *)((long)pCVar9->idx + lVar30 + -8);
      iVar15 = *(int *)((long)pCVar9->idx + lVar30 + -4);
      iVar36 = *(int *)((long)pCVar9->idx + lVar30);
      LossyDctEncoder_base_construct
                (&local_380,me->_dwaCompressionLevel / 100000.0,puVar25,packedDc,
                 dwaCompressorToNonlinear,(pCVar24[iVar16].chan)->width,
                 (pCVar24[iVar16].chan)->height);
      local_380._channel_encode_data_count = 3;
      local_380._channel_encode_data[0] = &pCVar24[iVar16]._dctData;
      local_380._channel_encode_data[1] = &pCVar24[iVar15]._dctData;
      local_380._channel_encode_data[2] = &pCVar24[iVar36]._dctData;
      eVar14 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&local_380);
      __s[8] = __s[8] + local_380._numAcComp;
      __s[9] = __s[9] + local_380._numDcComp;
      pCVar24 = me->_channelData;
      pCVar24[*(int *)((long)pCVar9->idx + lVar30 + -8)].processed = 1;
      pCVar24[*(int *)((long)pCVar9->idx + lVar30 + -4)].processed = 1;
      pCVar24[*(int *)((long)pCVar9->idx + lVar30)].processed = 1;
      if (eVar14 != 0) {
        return 1;
      }
      packedDc = packedDc + local_380._numDcComp * 2;
      puVar25 = puVar25 + local_380._numAcComp * 2;
      lVar29 = lVar29 + 1;
      lVar30 = lVar30 + 0xc;
    } while (lVar29 < me->_numCscChannelSets);
  }
  iVar16 = me->_numChannels;
  if (0 < iVar16) {
    lVar29 = 0x1f8;
    lVar30 = 0;
    do {
      pCVar24 = me->_channelData;
      if (pCVar24[lVar30].processed == 0) {
        pCVar2 = pCVar24 + lVar30;
        peVar10 = pCVar24[lVar30].chan;
        CVar6 = pCVar2->compression;
        if (CVar6 == UNKNOWN) {
          if ((pCVar2->_dctData)._size != 0) {
            sVar31 = (long)peVar10->bytes_per_element * (long)peVar10->width;
            puVar27 = pCVar2->planarUncBufferEnd;
            uVar26 = 0;
            do {
              memcpy(puVar27,(pCVar2->_dctData)._rows[uVar26],sVar31);
              puVar27 = pCVar2->planarUncBufferEnd + sVar31;
              pCVar2->planarUncBufferEnd = puVar27;
              uVar26 = uVar26 + 1;
            } while (uVar26 < (pCVar2->_dctData)._size);
          }
          __s[1] = __s[1] + pCVar2->planarUncSize;
        }
        else if (CVar6 == LOSSY_DCT) {
          toNonlinear = (uint16_t *)0x0;
          if (peVar10->p_linear == '\0') {
            toNonlinear = dwaCompressorToNonlinear;
          }
          LossyDctEncoder_base_construct
                    (&local_380,me->_dwaCompressionLevel / 100000.0,puVar25,packedDc,toNonlinear,
                     peVar10->width,peVar10->height);
          local_380._channel_encode_data_count = 1;
          local_380._channel_encode_data[0] = &pCVar2->_dctData;
          eVar14 = LossyDctEncoder_execute(me->alloc_fn,me->free_fn,&local_380);
          auVar3 = *(undefined1 (*) [16])(__s + 8);
          __s[8] = local_380._numAcComp + auVar3._0_8_;
          __s[9] = local_380._numDcComp + auVar3._8_8_;
          if (eVar14 != 0) {
            return 1;
          }
          puVar25 = puVar25 + local_380._numAcComp * 2;
          packedDc = packedDc + local_380._numDcComp * 2;
        }
        else {
          if (CVar6 != RLE) {
            return 3;
          }
          if ((pCVar2->_dctData)._size != 0) {
            iVar16 = peVar10->width;
            uVar23 = (ulong)(byte)peVar10->bytes_per_element;
            uVar26 = 0;
            do {
              if (0 < iVar16) {
                puVar27 = (pCVar2->_dctData)._rows[uVar26];
                iVar15 = 0;
                do {
                  if ('\0' < (char)uVar23) {
                    lVar28 = 0;
                    do {
                      uVar4 = puVar27[lVar28];
                      puVar11 = *(uint8_t **)
                                 ((long)(pCVar24->_dctData)._dctData + lVar28 * 8 + lVar29);
                      *(uint8_t **)((long)(pCVar24->_dctData)._dctData + lVar28 * 8 + lVar29) =
                           puVar11 + 1;
                      *puVar11 = uVar4;
                      lVar28 = lVar28 + 1;
                      uVar23 = (ulong)peVar10->bytes_per_element;
                    } while (lVar28 < (long)uVar23);
                    iVar16 = peVar10->width;
                    puVar27 = puVar27 + lVar28;
                  }
                  iVar15 = iVar15 + 1;
                } while (iVar15 < iVar16);
              }
              __s[7] = __s[7] + (long)(char)uVar23 * (long)iVar16;
              uVar26 = uVar26 + 1;
            } while (uVar26 < (pCVar2->_dctData)._size);
          }
        }
        pCVar2->processed = 1;
        iVar16 = me->_numChannels;
      }
      lVar30 = lVar30 + 1;
      lVar29 = lVar29 + 0x240;
    } while (lVar30 < iVar16);
  }
  sVar21 = __s[1];
  if (sVar21 != 0) {
    puVar25 = me->_planarUncBuffer[0];
    p_Var12 = me->_encode->context;
    sVar18 = exr_compress_max_buffer_size(sVar21);
    eVar14 = exr_compress_buffer(p_Var12,9,puVar25,sVar21,local_3c8,sVar18,(size_t *)&local_380);
    if (eVar14 != 0) {
      return eVar14;
    }
    local_3c8 = (void *)((long)local_3c8 + (long)local_380._toNonlinear);
    __s[2] = local_380._toNonlinear;
    local_3b8 = local_3b8 + (long)local_380._toNonlinear;
  }
  uVar20 = __s[8];
  if (uVar20 != 0) {
    encbytes = __s + 3;
    if (me->_acCompression == DEFLATE) {
      puVar25 = me->_packedAcBuffer;
      p_Var12 = me->_encode->context;
      sVar21 = exr_compress_max_buffer_size(uVar20 * 2);
      eVar14 = exr_compress_buffer(p_Var12,9,puVar25,uVar20 * 2,local_3c8,sVar21,
                                   (size_t *)&local_380);
      if (eVar14 != 0) {
        return eVar14;
      }
      *encbytes = (uint64_t)local_380._toNonlinear;
      puVar19 = local_380._toNonlinear;
    }
    else {
      if (me->_acCompression != STATIC_HUFFMAN) {
        return 3;
      }
      eVar14 = internal_huf_compress
                         (encbytes,local_3c8,(long)__s + (local_398 - (long)local_3c8),
                          (uint16_t *)me->_packedAcBuffer,uVar20,me->_encode->scratch_buffer_1,
                          me->_encode->scratch_alloc_size_1);
      if (eVar14 == 4) {
        peVar22 = me->_encode;
        memcpy(peVar22->compressed_buffer,peVar22->packed_buffer,peVar22->packed_alloc_size);
        peVar22 = me->_encode;
        sVar21 = peVar22->packed_alloc_size;
        goto LAB_00109087;
      }
      if (eVar14 != 0) {
        return eVar14;
      }
      puVar19 = (uint16_t *)*encbytes;
    }
    local_3c8 = (void *)((long)local_3c8 + (long)puVar19);
    local_3b8 = local_3b8 + (long)puVar19;
  }
  if (__s[9] != 0) {
    sVar21 = __s[9] * 2;
    peVar22 = me->_encode;
    eVar14 = internal_encode_alloc_buffer
                       (peVar22,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar22->scratch_buffer_1,
                        &peVar22->scratch_alloc_size_1,sVar21);
    if (eVar14 != 0) {
      return eVar14;
    }
    internal_zip_deconstruct_bytes
              ((uint8_t *)me->_encode->scratch_buffer_1,me->_packedDcBuffer,sVar21);
    iVar16 = me->_zipLevel;
    p_Var12 = me->_encode->context;
    in = me->_encode->scratch_buffer_1;
    sVar18 = exr_compress_max_buffer_size(sVar21);
    eVar14 = exr_compress_buffer(p_Var12,iVar16,in,sVar21,local_3c8,sVar18,(size_t *)&local_380);
    if (eVar14 != 0) {
      return eVar14;
    }
    __s[4] = local_380._toNonlinear;
    local_3c8 = (void *)((long)local_3c8 + (long)local_380._toNonlinear);
    local_3b8 = local_3b8 + (long)local_380._toNonlinear;
  }
  if (__s[7] != 0) {
    uVar20 = internal_rle_compress(me->_rleBuffer,me->_rleBufferSize,me->_planarUncBuffer[2],__s[7])
    ;
    __s[6] = uVar20;
    puVar25 = me->_rleBuffer;
    p_Var12 = me->_encode->context;
    sVar21 = exr_compress_max_buffer_size(uVar20);
    eVar14 = exr_compress_buffer(p_Var12,9,puVar25,uVar20,local_3c8,sVar21,(size_t *)&local_380);
    if (eVar14 != 0) {
      return eVar14;
    }
    __s[5] = local_380._toNonlinear;
    local_3c8 = (void *)((long)local_3c8 + (long)local_380._toNonlinear);
    local_3b8 = local_3b8 + (long)local_380._toNonlinear;
  }
  peVar22 = me->_encode;
  if (local_3b8 != (long)local_3c8 - (long)peVar22->compressed_buffer) {
    return 0x17;
  }
  if (local_3b8 < peVar22->packed_bytes) {
    peVar22->compressed_bytes = local_3b8;
    return 0;
  }
  memcpy(peVar22->compressed_buffer,peVar22->packed_buffer,peVar22->packed_bytes);
  peVar22 = me->_encode;
  sVar21 = peVar22->packed_bytes;
LAB_00109087:
  peVar22->compressed_bytes = sVar21;
  return 0;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t*    sizes;
    size_t       outBufferSize = 0;
    uint64_t     dataBytes, nWritten = 0;
    uint64_t     nAvail;
    uint64_t     fileVersion = 2;
    uint64_t*    version;
    uint64_t*    unknownUncompressedSize;
    uint64_t*    unknownCompressedSize;
    uint64_t*    acCompressedSize;
    uint64_t*    dcCompressedSize;
    uint64_t*    rleCompressedSize;
    uint64_t*    rleUncompressedSize;
    uint64_t*    rleRawSize;

    uint64_t* totalAcUncompressedCount;
    uint64_t* totalDcUncompressedCount;

    uint64_t* acCompression;
    uint8_t*  packedAcEnd;
    uint8_t*  packedDcEnd;
    uint8_t*  outDataPtr;
    uint8_t*  inDataPtr;

    // Starting with DWA v2, we write the channel
    // classification rules into the file
    me->_channelRules     = sDefaultChannelRules;
    me->_channelRuleCount = sizeof (sDefaultChannelRules) / sizeof (Classifier);

    rv = DwaCompressor_initializeBuffers (me, &outBufferSize);

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail = outBufferSize;
    sizes  = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    version                 = OBIDX (VERSION);
    unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    rleRawSize              = OBIDX (RLE_RAW_SIZE);

    totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    acCompression = OBIDX (AC_COMPRESSION);
    packedAcEnd   = NULL;
    packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    outDataPtr = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (int c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    inDataPtr = me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (
                me->alloc_fn, me->free_fn, &(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (int csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS)
            rv = LossyDctEncoder_execute (me->alloc_fn, me->free_fn, &enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (
                            me->alloc_fn, me->free_fn, &enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += (uint64_t) pchan->width *
                                   (uint64_t) pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize = (size_t) pchan->width *
                                          (size_t) pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS) return rv;

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    me->_encode->context,
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS) return rv;

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            me->_encode->scratch_buffer_1, me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_encode->context,
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        size_t compBytes;
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}